

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int8_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy>::
quantize_gradient_org
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::encoder_strategy> *this,
          int32_t di)

{
  int8_t iVar1;
  
  iVar1 = -4;
  if (-this->t3_ < di) {
    iVar1 = -3;
    if (-this->t2_ < di) {
      iVar1 = -2;
      if (-this->t1_ < di) {
        if (di < 0) {
          iVar1 = -1;
        }
        else {
          if (di == 0) {
            return '\0';
          }
          iVar1 = '\x01';
          if ((this->t1_ <= di) && (iVar1 = '\x02', this->t2_ <= di)) {
            return '\x04' - (di < this->t3_);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int8_t quantize_gradient_org(const int32_t di) const noexcept
    {
        if (di <= -t3_)
            return -4;
        if (di <= -t2_)
            return -3;
        if (di <= -t1_)
            return -2;
        if (di < -traits_.near_lossless)
            return -1;
        if (di <= traits_.near_lossless)
            return 0;
        if (di < t1_)
            return 1;
        if (di < t2_)
            return 2;
        if (di < t3_)
            return 3;

        return 4;
    }